

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_ResizeHysteresis_Test<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ResizeHysteresis_Test<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  char *pcVar2;
  key_type file;
  value_type lhs_expression;
  HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  unsigned_long *lhs;
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  *this_01;
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  *in_RDI;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  TypeParam ht;
  AssertionResult gtest_ar;
  size_type old_bucket_count;
  key_type *in_stack_fffffffffffffd28;
  HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffd30;
  unsigned_long *in_stack_fffffffffffffd38;
  int iVar3;
  HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffd40;
  char *in_stack_fffffffffffffd48;
  int line;
  allocator_type *in_stack_fffffffffffffd50;
  key_equal *in_stack_fffffffffffffd58;
  Type type;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  uint i;
  Hasher *this_02;
  Hasher *this_03;
  value_type *in_stack_fffffffffffffda8;
  int *message;
  AssertionResult local_230;
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  *local_220;
  unsigned_long *local_1f0;
  HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  *local_1e8;
  value_type local_1b8;
  key_type local_1b0;
  undefined4 local_194;
  size_type local_190;
  AssertionResult local_188;
  Alloc<ValueType,_unsigned_long,_18446744073709551615UL> local_178;
  Hasher local_168;
  Hasher local_15c [15];
  size_type local_a0;
  AssertionResult local_98;
  key_type local_88;
  value_type local_58;
  key_type local_50;
  value_type local_20;
  size_type local_18;
  key_type local_10;
  
  local_10 = HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  local_18 = google::
             BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket_count((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0x1008d30);
  local_20 = HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffffd30,
                            (int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_RDI,in_stack_fffffffffffffda8);
  local_50 = HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
           *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  local_58 = HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffffd30,
                            (int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_RDI,in_stack_fffffffffffffda8);
  message = &(in_RDI->ht_).settings.
             super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.super_Hasher.
             num_compares_;
  local_88 = HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
           *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  local_a0 = google::
             BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket_count((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0x1008e3f);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
             (unsigned_long *)in_stack_fffffffffffffd30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_98);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    testing::AssertionResult::failure_message((AssertionResult *)0x1008ea6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
               (Type)((ulong)in_stack_fffffffffffffd58 >> 0x20),(char *)in_stack_fffffffffffffd50,
               (int)((ulong)in_stack_fffffffffffffd48 >> 0x20),(char *)in_stack_fffffffffffffd40);
    testing::internal::AssertHelper::operator=((AssertHelper *)in_RDI,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd30);
    testing::Message::~Message((Message *)0x1008f03);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1008f74);
  this_02 = local_15c;
  i = 0;
  Hasher::Hasher(this_02,0);
  this_03 = &local_168;
  Hasher::Hasher(this_03,i);
  Alloc<ValueType,_unsigned_long,_18446744073709551615UL>::Alloc(&local_178,i,(int *)(ulong)i);
  google::
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
              *)this_03,(size_type)this_02,(hasher *)CONCAT44(i,in_stack_fffffffffffffd60),
             in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  type = (Type)((ulong)in_stack_fffffffffffffd58 >> 0x20);
  Alloc<ValueType,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_178);
  local_190 = google::
              BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0x1008ff7);
  local_194 = 0x20;
  testing::internal::CmpHelperLT<unsigned_long,unsigned_int>
            (in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
             (uint *)in_stack_fffffffffffffd30);
  iVar3 = (int)((ulong)in_stack_fffffffffffffd38 >> 0x20);
  line = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_188);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(i,in_stack_fffffffffffffd60));
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10090bc);
    type = (Type)((ulong)pcVar2 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(i,in_stack_fffffffffffffd60),type,
               (char *)in_stack_fffffffffffffd50,line,(char *)in_stack_fffffffffffffd40);
    testing::internal::AssertHelper::operator=((AssertHelper *)in_RDI,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd30);
    testing::Message::~Message((Message *)0x1009119);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x100918a);
  file = HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueKey(in_stack_fffffffffffffd40,iVar3);
  local_1b0 = file;
  google::
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  local_18 = google::
             BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket_count((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0x10091d4);
  lhs_expression =
       HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
       ::UniqueObject(in_stack_fffffffffffffd30,(int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
  local_1b8 = lhs_expression;
  google::
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_RDI,(value_type *)message);
  this_00 = (HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
             *)HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffffd40,iVar3);
  local_1e8 = this_00;
  google::
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
           *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  lhs = (unsigned_long *)
        HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
        ::UniqueObject(in_stack_fffffffffffffd30,(int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
  local_1f0 = lhs;
  google::
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_RDI,(value_type *)message);
  this_01 = (BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
             *)HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_00,(int)((ulong)lhs >> 0x20));
  local_220 = this_01;
  google::
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase(this_01,in_stack_fffffffffffffd28);
  google::
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::bucket_count((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                  *)0x10092ed);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (lhs_expression,(char *)this_00,lhs,(unsigned_long *)this_01);
  iVar3 = (int)((ulong)lhs_expression >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_230);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(i,in_stack_fffffffffffffd60));
    testing::AssertionResult::failure_message((AssertionResult *)0x1009368);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(i,in_stack_fffffffffffffd60),type,file,iVar3,(char *)this_00
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)in_RDI,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0x10093c3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x100942e);
  google::
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
              *)0x100943b);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ResizeHysteresis) {
  // We want to make sure that when we create a hashtable, and then
  // add and delete one element, the size of the hashtable doesn't
  // change.
  this->ht_.set_deleted_key(this->UniqueKey(1));
  typename TypeParam::size_type old_bucket_count = this->ht_.bucket_count();
  this->ht_.insert(this->UniqueObject(4));
  this->ht_.erase(this->UniqueKey(4));
  this->ht_.insert(this->UniqueObject(4));
  this->ht_.erase(this->UniqueKey(4));
  EXPECT_EQ(old_bucket_count, this->ht_.bucket_count());

  // Try it again, but with a hashtable that starts very small
  TypeParam ht(2);
  EXPECT_LT(ht.bucket_count(), 32u);  // verify we really do start small
  ht.set_deleted_key(this->UniqueKey(1));
  old_bucket_count = ht.bucket_count();
  ht.insert(this->UniqueObject(4));
  ht.erase(this->UniqueKey(4));
  ht.insert(this->UniqueObject(4));
  ht.erase(this->UniqueKey(4));
  EXPECT_EQ(old_bucket_count, ht.bucket_count());
}